

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void timeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  int iVar2;
  char zBuf [16];
  DateTime x;
  
  iVar2 = isDate(context,argc,argv,&x);
  if (iVar2 == 0) {
    computeHMS(&x);
    zBuf[0] = (char)((long)((ulong)(uint)((int)((long)x.h / 10) >> 0x1f) << 0x20 |
                           (long)x.h / 10 & 0xffffffffU) % 10) + '0';
    zBuf[1] = (char)(x.h % 10) + '0';
    zBuf[2] = ':';
    zBuf[3] = (char)((long)((ulong)(uint)((int)((long)x.m / 10) >> 0x1f) << 0x20 |
                           (long)x.m / 10 & 0xffffffffU) % 10) + '0';
    zBuf[4] = (char)(x.m % 10) + '0';
    zBuf[5] = ':';
    uVar1 = (long)(int)x.s / 10;
    zBuf[6] = (char)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 10) +
              '0';
    zBuf[7] = (char)((int)x.s % 10) + '0';
    zBuf[8] = '\0';
    sqlite3_result_text(context,zBuf,8,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void timeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int s;
    char zBuf[16];
    computeHMS(&x);
    zBuf[0] = '0' + (x.h/10)%10;
    zBuf[1] = '0' + (x.h)%10;
    zBuf[2] = ':';
    zBuf[3] = '0' + (x.m/10)%10;
    zBuf[4] = '0' + (x.m)%10;
    zBuf[5] = ':';
    s = (int)x.s;
    zBuf[6] = '0' + (s/10)%10;
    zBuf[7] = '0' + (s)%10;
    zBuf[8] = 0;
    sqlite3_result_text(context, zBuf, 8, SQLITE_TRANSIENT);
  }
}